

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Utility.cpp
# Opt level: O0

void __thiscall UtilityTest_Pack16Test_Test::TestBody(UtilityTest_Pack16Test_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_8;
  Message local_188;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_7;
  Message local_160;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_6;
  size_t offset3;
  uint8_t data3 [6];
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  Message local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  Message local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  size_t offset2;
  uint8_t data2 [4];
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  size_t offset1;
  UtilityTest_Pack16Test_Test *pUStack_10;
  uint8_t data1 [2];
  UtilityTest_Pack16Test_Test *this_local;
  
  pUStack_10 = this;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Pack16((uint8_t *)((long)&offset1 + 6),0,0xabcd);
  local_34 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_30,"offset1","2",(unsigned_long *)&gtest_ar.message_,&local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_6c = 0xab;
  testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
            ((EqHelper *)local_68,"data1[0]","0xAB",(uchar *)((long)&offset1 + 6),&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_94 = 0xcd;
  testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
            ((EqHelper *)local_90,"data1[1]","0xCD",(uchar *)((long)&offset1 + 7),&local_94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff58,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff58);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  offset2._4_4_ = 0;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Pack16((uint8_t *)((long)&offset2 + 4),1,0x3456);
  local_cc = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c8,"offset2","3",(unsigned_long *)&gtest_ar_3.message_,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_f4 = 0x34;
  testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
            ((EqHelper *)local_f0,"data2[1]","0x34",(uchar *)((long)&offset2 + 5),&local_f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_11c = 0x56;
  testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
            ((EqHelper *)local_118,"data2[2]","0x56",(uchar *)((long)&offset2 + 6),&local_11c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)data3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)data3,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)data3);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  offset3._4_2_ = 0;
  offset3._0_4_ = 0;
  gtest_ar_6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Pack16((uint8_t *)&offset3,3,0x4455);
  local_154 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_150,"offset3","5",(unsigned_long *)&gtest_ar_6.message_,&local_154);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_17c = 0x44;
  testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
            ((EqHelper *)local_178,"data3[3]","0x44",(uchar *)((long)&offset3 + 3),&local_17c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1a4 = 0x55;
  testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
            ((EqHelper *)local_1a0,"data3[4]","0x55",(uchar *)((long)&offset3 + 4),&local_1a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test/tinytcp/test_Utility.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  return;
}

Assistant:

TEST(UtilityTest, Pack16Test) {
    // Test case 1: Packing a single byte
    uint8_t data1[2];
    size_t offset1 = Pack16(data1, 0, 0xABCD);
    EXPECT_EQ(offset1, 2);
    EXPECT_EQ(data1[0], 0xAB);
    EXPECT_EQ(data1[1], 0xCD);

    // Test case 2: Packing a byte at a non-zero offset
    uint8_t data2[4] = {0x00, 0x00, 0x00, 0x00};
    size_t offset2 = Pack16(data2, 1, 0x3456);
    EXPECT_EQ(offset2, 3);
    EXPECT_EQ(data2[1], 0x34);
    EXPECT_EQ(data2[2], 0x56);

    // Test case 3: Packing a byte in a larger array
    uint8_t data3[6] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
    size_t offset3 = Pack16(data3, 3, 0x4455);
    EXPECT_EQ(offset3, 5);
    EXPECT_EQ(data3[3], 0x44);
    EXPECT_EQ(data3[4], 0x55);
}